

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.cpp
# Opt level: O3

double util::rpn_eval(stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *stack,unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                             *vars)

{
  char cVar1;
  code *pcVar2;
  _Elt_pointer pbVar3;
  int iVar4;
  const_iterator cVar5;
  _Elt_pointer pdVar6;
  runtime_error *this;
  _Elt_pointer pbVar7;
  ulong uVar8;
  long lVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  vector<double,_std::allocator<double>_> args;
  stack<double,_std::deque<double,_std::allocator<double>_>_> argstack;
  double local_d0;
  double local_c8;
  vector<double,_std::allocator<double>_> local_c0;
  _Deque_base<double,_std::allocator<double>_> local_a8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_50;
  vector<double,_std::allocator<double>_> local_48;
  string *__k;
  
  local_50 = &vars->_M_h;
  if (rpn_eval(std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::unordered_map<std::__cxx11::string,double,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>const&)
      ::rpn_eval_funcs == '\0') {
    rpn_eval();
  }
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_last = (double *)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur = (double *)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_first = (double *)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_cur = (double *)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<double,_std::allocator<double>_>::_M_initialize_map(&local_a8,0);
  if ((stack->c).
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      (stack->c).
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
LAB_00192a37:
    if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_a8._M_impl.super__Deque_impl_data._M_start._M_cur) {
      uVar10 = 0;
      uVar11 = 0;
    }
    else {
      pdVar6 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_a8._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pdVar6 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      uVar10 = SUB84(pdVar6[-1],0);
      uVar11 = (undefined4)((ulong)pdVar6[-1] >> 0x20);
    }
    local_d0 = (double)CONCAT44(uVar11,uVar10);
LAB_00192a68:
    std::_Deque_base<double,_std::allocator<double>_>::~_Deque_base(&local_a8);
    return local_d0;
  }
LAB_00192814:
  do {
    pbVar7 = (stack->c).
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pbVar7 == (stack->c).
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pbVar7 = (stack->c).
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
    }
    __k = pbVar7 + -1;
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back(&stack->c);
    lVar9 = 0x18;
    while ((iVar4 = std::__cxx11::string::compare((char *)__k), iVar4 != 0 &&
           ((cVar1 = *(char *)((long)&timeago[abi:cxx11](double,double)::times_abi_cxx11_.
                                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar9),
            cVar1 == ' ' || (*(__k->_M_dataplus)._M_p != cVar1))))) {
      lVar9 = lVar9 + 0x20;
      if (lVar9 == 0x458) goto LAB_00192869;
    }
    std::vector<double,_std::allocator<double>_>::vector
              (&local_c0,*(size_type *)(&rand_init::rand_init::initialized + lVar9),
               (allocator_type *)&local_c8);
    if (*(long *)(&rand_init::rand_init::initialized + lVar9) != 0) {
      uVar8 = 0;
      do {
        if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_a8._M_impl.super__Deque_impl_data._M_start._M_cur) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this,"RPN Stack underflow");
          __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        pdVar6 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_a8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pdVar6 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[uVar8] = pdVar6[-1];
        if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_a8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          operator_delete(local_a8._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
          local_a8._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_a8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_a8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_a8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40;
          local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_a8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f;
          local_a8._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_a8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < *(ulong *)(&rand_init::rand_init::initialized + lVar9));
    }
    pcVar2 = *(code **)(&rpn_eval::rpn_eval_funcs[0].op + lVar9);
    std::vector<double,_std::allocator<double>_>::vector(&local_48,&local_c0);
    local_c8 = (double)(*pcVar2)(&local_48);
    std::deque<double,_std::allocator<double>_>::emplace_back<double>
              ((deque<double,_std::allocator<double>_> *)&local_a8,&local_c8);
    if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    pbVar7 = (stack->c).
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    pbVar3 = (stack->c).
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pbVar3 == pbVar7) {
      pdVar6 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_a8._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pdVar6 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      local_d0 = pdVar6[-1];
    }
    if (local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (pbVar3 == pbVar7) goto LAB_00192a68;
  } while( true );
LAB_00192869:
  cVar5 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(local_50,__k);
  if (cVar5.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
      ._M_cur == (__node_type *)0x0) {
    local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)tdparse(__k);
    std::deque<double,_std::allocator<double>_>::emplace_back<double>
              ((deque<double,_std::allocator<double>_> *)&local_a8,(double *)&local_c0);
  }
  else if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
           local_a8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<double,std::allocator<double>>::_M_push_back_aux<double_const&>
              ((deque<double,std::allocator<double>> *)&local_a8,
               (double *)
               ((long)cVar5.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
                      ._M_cur + 0x28));
  }
  else {
    *local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
         *(double *)
          ((long)cVar5.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
                 ._M_cur + 0x28);
    local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  if ((stack->c).
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      (stack->c).
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_00192a37;
  goto LAB_00192814;
}

Assistant:

double rpn_eval(std::stack<std::string> stack, const std::unordered_map<std::string, double>& vars)
{
	struct rpn_eval_func
	{
		char op;
		const char *name;
		std::size_t args;
		double (*func)(std::vector<double>);

		rpn_eval_func(char op_, const char *name_, std::size_t args_, double (*func_)(std::vector<double>)) : op(op_), name(name_), args(args_), func(func_) { }
	};

	static const rpn_eval_func rpn_eval_funcs[] = {
		rpn_eval_func('+', "add",   2, rpn_eval_add),
		rpn_eval_func('-', "sub",   2, rpn_eval_sub),
		rpn_eval_func('*', "mul",   2, rpn_eval_mul),
		rpn_eval_func('/', "div",   2, rpn_eval_div),
		rpn_eval_func('%', "mod",   2, rpn_eval_mod),
		rpn_eval_func('&', "bitand",2, rpn_eval_bitand),
		rpn_eval_func('|', "bitor", 2, rpn_eval_bitor),
		rpn_eval_func('^', "bitxor",2, rpn_eval_bitxor),
		rpn_eval_func('~', "bitnot",1, rpn_eval_bitnot),
		rpn_eval_func(op_and,"and", 2, rpn_eval_and),
		rpn_eval_func(op_or,"or",   2, rpn_eval_or),
		rpn_eval_func('!', "not",   1, rpn_eval_not),
		rpn_eval_func(op_neg,"neg", 1, rpn_eval_neg),
		rpn_eval_func(' ', "pow",   2, rpn_eval_pow),
		rpn_eval_func(' ', "sqrt",  1, rpn_eval_sqrt),
		rpn_eval_func(' ', "log",   1, rpn_eval_log),
		rpn_eval_func(' ', "exp",   1, rpn_eval_exp),
		rpn_eval_func(' ', "ln",    1, rpn_eval_ln),
		rpn_eval_func(' ', "sin",   1, rpn_eval_sin),
		rpn_eval_func(' ', "cos",   1, rpn_eval_cos),
		rpn_eval_func(' ', "tan",   1, rpn_eval_tan),
		rpn_eval_func(' ', "rand",  2, rpn_eval_rand),
		rpn_eval_func(' ', "min",   2, rpn_eval_min),
		rpn_eval_func(' ', "max",   2, rpn_eval_max),
		rpn_eval_func(' ', "ceil",  1, rpn_eval_ceil),
		rpn_eval_func(' ', "round", 1, rpn_eval_round),
		rpn_eval_func(' ', "floor", 1, rpn_eval_floor),
		rpn_eval_func('<', "lt",    2, rpn_eval_lt),
		rpn_eval_func(op_lte,"lte", 2, rpn_eval_lte),
		rpn_eval_func('=', "eq",    2, rpn_eval_eq),
		rpn_eval_func(op_ne,"ne",   2, rpn_eval_ne),
		rpn_eval_func(op_gte,"gte", 2, rpn_eval_gte),
		rpn_eval_func('>', "gt",    2, rpn_eval_gt),

		rpn_eval_func('?', "iif",   3, rpn_eval_iif),
	};

	std::stack<double> argstack;

	while (!stack.empty())
	{
		start_of_loop:

		const std::string& val = stack.top();
		stack.pop();

		for (std::size_t i = 0; i < sizeof(rpn_eval_funcs) / sizeof(rpn_eval_func); ++i)
		{
			const rpn_eval_func &func = rpn_eval_funcs[i];

			if (val == func.name || (func.op != ' ' && val[0] == func.op))
			{
				std::vector<double> args(func.args);

				for (std::size_t ii = 0; ii < func.args; ++ii)
				{
					if (argstack.empty())
					{
						throw std::runtime_error("RPN Stack underflow");
					}

					args[ii] = argstack.top();
					argstack.pop();
				}

				argstack.push(func.func(args));

				if (stack.empty())
					return argstack.top();

				goto start_of_loop;
			}
		}

		auto findvar = vars.find(val);

		if (findvar != vars.end())
		{
			argstack.push(findvar->second);
		}
		else
		{
			argstack.push(util::tdparse(val));
		}
	}

	if (argstack.empty())
		return 0.0;

	return argstack.top();
}